

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

int test_auth_pubkey(LIBSSH2_SESSION *session,int flags,char *username,char *password,char *fn_pub,
                    char *fn_priv)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *privatekey;
  size_t local_60;
  size_t len;
  char *buffer;
  char *userauth_list;
  char *pcStack_40;
  int rc;
  char *fn_priv_local;
  char *fn_pub_local;
  char *password_local;
  char *username_local;
  LIBSSH2_SESSION *pLStack_18;
  int flags_local;
  LIBSSH2_SESSION *session_local;
  
  pcStack_40 = fn_priv;
  fn_priv_local = fn_pub;
  fn_pub_local = password;
  password_local = username;
  username_local._4_4_ = flags;
  pLStack_18 = session;
  iVar2 = openssh_fixture_have_docker();
  if (((iVar2 == 0) && (iVar2 = strcmp(password_local,"libssh2"), iVar2 == 0)) &&
     (password_local = getenv("USER"), password_local == (char *)0x0)) {
    password_local = getenv("LOGNAME");
  }
  pLVar1 = pLStack_18;
  pcVar5 = password_local;
  sVar3 = strlen(password_local);
  buffer = libssh2_userauth_list(pLVar1,pcVar5,(uint)sVar3);
  if (buffer == (char *)0x0) {
    print_last_session_error("libssh2_userauth_list");
    session_local._4_4_ = 1;
  }
  else {
    pcVar4 = strstr(buffer,"publickey");
    pLVar1 = pLStack_18;
    pcVar5 = password_local;
    if (pcVar4 == (char *)0x0) {
      fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",buffer);
      session_local._4_4_ = 1;
    }
    else {
      if ((username_local._4_4_ & 2) == 0) {
        sVar3 = strlen(password_local);
        pcVar4 = srcdir_path(fn_priv_local);
        privatekey = srcdir_path(pcStack_40);
        userauth_list._4_4_ =
             libssh2_userauth_publickey_fromfile_ex
                       (pLVar1,pcVar5,(uint)sVar3,pcVar4,privatekey,fn_pub_local);
      }
      else {
        len = 0;
        local_60 = 0;
        pcVar5 = srcdir_path(pcStack_40);
        iVar2 = read_file(pcVar5,(char **)&len,&local_60);
        pLVar1 = pLStack_18;
        pcVar5 = password_local;
        if (iVar2 != 0) {
          fprintf(_stderr,"Reading key file failed.\n");
          return 1;
        }
        sVar3 = strlen(password_local);
        userauth_list._4_4_ =
             libssh2_userauth_publickey_frommemory
                       (pLVar1,pcVar5,sVar3,(char *)0x0,0,(char *)len,local_60,(char *)0x0);
        free((void *)len);
      }
      if ((username_local._4_4_ & 1) == 0) {
        if (userauth_list._4_4_ != 0) {
          print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
          return 1;
        }
      }
      else if (userauth_list._4_4_ == 0) {
        fprintf(_stderr,"Public-key auth succeeded with wrong key\n");
        return 1;
      }
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int test_auth_pubkey(LIBSSH2_SESSION *session, int flags,
                     const char *username,
                     const char *password,
                     const char *fn_pub,
                     const char *fn_priv)
{
    int rc;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker() && strcmp(username, "libssh2") == 0) {
        username = getenv("USER");
        if(!username) {
#ifdef _WIN32
            username = getenv("USERNAME");
#else
            username = getenv("LOGNAME");
#endif
        }
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    if((flags & TEST_AUTH_FROMMEM) != 0) {
        char *buffer = NULL;
        size_t len = 0;

        if(read_file(srcdir_path(fn_priv), &buffer, &len)) {
            fprintf(stderr, "Reading key file failed.\n");
            return 1;
        }

        rc = libssh2_userauth_publickey_frommemory(session,
                                                   username, strlen(username),
                                                   NULL, 0,
                                                   buffer, len,
                                                   NULL);

        free(buffer);
    }
    else {
        rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                    srcdir_path(fn_pub),
                                                    srcdir_path(fn_priv),
                                                    password);
    }

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Public-key auth succeeded with wrong key\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
            return 1;
        }
    }

    return 0;
}